

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# questpgr.c
# Opt level: O2

qtmsg * construct_qtlist(long hdr_offset)

{
  int iVar1;
  undefined8 in_RAX;
  qtmsg *ptr;
  int n_msgs;
  
  n_msgs = (int)((ulong)in_RAX >> 0x20);
  dlb_fseek(msg_file,hdr_offset,0);
  Fread(&n_msgs,4,1,msg_file);
  iVar1 = n_msgs;
  ptr = (qtmsg *)malloc((ulong)(n_msgs + 1) * 0x18);
  Fread(ptr,iVar1 * 0x18,1,msg_file);
  ptr[n_msgs].msgnum = -1;
  return ptr;
}

Assistant:

static struct qtmsg *construct_qtlist(long hdr_offset)
{
	struct qtmsg *msg_list;
	int	n_msgs;

	dlb_fseek(msg_file, hdr_offset, SEEK_SET);
	Fread(&n_msgs, sizeof(int), 1, msg_file);
	msg_list = malloc((unsigned)(n_msgs+1)*sizeof(struct qtmsg));

	/*
	 * Load up the list.
	 */
	Fread(msg_list, n_msgs*sizeof(struct qtmsg), 1, msg_file);

	msg_list[n_msgs].msgnum = -1;
	return msg_list;
}